

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O3

void __thiscall
TPZFrontNonSym<std::complex<long_double>_>::Expand
          (TPZFrontNonSym<std::complex<long_double>_> *this,int larger)

{
  complex<long_double> *pcVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  longdouble local_38;
  longdouble local_28;
  
  local_38 = (longdouble)0;
  local_28 = local_38;
  TPZVec<std::complex<long_double>_>::Resize
            (&(this->super_TPZFront<std::complex<long_double>_>).fData,
             (ulong)(uint)(larger * larger),(complex<long_double> *)&local_38);
  lVar6 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
  if (0 < lVar6) {
    lVar7 = lVar6 << 5;
    lVar8 = (lVar6 + -1) * (long)larger * 0x20;
    do {
      lVar7 = lVar7 + -0x20;
      lVar9 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
      if (0 < lVar9) {
        uVar10 = lVar9 + 1;
        lVar9 = lVar9 << 5;
        do {
          pcVar1 = (this->super_TPZFront<std::complex<long_double>_>).fData.fStore;
          lVar11 = (this->super_TPZFront<std::complex<long_double>_>).fMaxFront * lVar7;
          uVar3 = *(undefined8 *)(pcVar1[-1]._M_value + lVar11 + lVar9);
          uVar4 = *(undefined8 *)((long)(pcVar1[-1]._M_value + lVar11 + lVar9) + 8);
          uVar5 = *(undefined8 *)((long)(pcVar1->_M_value + lVar9 + -0x10 + lVar11) + 8);
          *(undefined8 *)(pcVar1->_M_value + lVar9 + -0x10 + lVar8) =
               *(undefined8 *)(pcVar1->_M_value + lVar9 + -0x10 + lVar11);
          *(undefined8 *)((long)(pcVar1->_M_value + lVar9 + -0x10 + lVar8) + 8) = uVar5;
          *(undefined8 *)(pcVar1[-1]._M_value + lVar8 + lVar9) = uVar3;
          *(undefined8 *)((long)(pcVar1[-1]._M_value + lVar8 + lVar9) + 8) = uVar4;
          if (lVar6 + -1 != 0) {
            lVar11 = (this->super_TPZFront<std::complex<long_double>_>).fMaxFront * lVar7;
            pcVar1 = (this->super_TPZFront<std::complex<long_double>_>).fData.fStore;
            *(longdouble *)(pcVar1[-1]._M_value + lVar11 + lVar9) = (longdouble)0;
            *(longdouble *)(pcVar1->_M_value + lVar9 + -0x10 + lVar11) = (longdouble)0;
          }
          uVar10 = uVar10 - 1;
          lVar9 = lVar9 + -0x20;
        } while (1 < uVar10);
      }
      lVar8 = lVar8 + (long)larger * -0x20;
      bVar2 = 1 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar2);
  }
  (this->super_TPZFront<std::complex<long_double>_>).fMaxFront = larger;
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::Expand(int larger) {
	//	PrintGlobal("Antes do Expande");
	this->fData.Resize(larger*larger,0.);
    int64_t i,j;
	for(j=this->fFront-1;j>=0;j--){
		for(i=this->fFront-1;i>=0;i--){
			this->fData[j*larger + i]=this->fData[j*this->fMaxFront + i];
			if(j) this->fData[j*this->fMaxFront+i] = 0.;
		}
	}
	this->fMaxFront = larger;
}